

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

void Gia_ManDupAndConesLimit_rec(Gia_Man_t *pNew,Gia_Man_t *p,int iObj,int Level)

{
  Gia_Obj_t *pGVar1;
  Vec_Int_t *p_00;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  
  if ((iObj < 0) || (p->nObjs <= iObj)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if (p->pObjs[(uint)iObj].Value != 0xffffffff) {
    return;
  }
  pGVar1 = p->pObjs + (uint)iObj;
  if ((~*(uint *)pGVar1 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar1) {
    p_00 = p->vLevels;
    Vec_IntFillExtra(p_00,iObj + 1,0);
    if (p_00->nSize <= iObj) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if (Level <= p_00->pArray[(uint)iObj]) {
      Gia_ManDupAndConesLimit_rec(pNew,p,iObj - (*(uint *)pGVar1 & 0x1fffffff),Level);
      Gia_ManDupAndConesLimit_rec(pNew,p,iObj - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff),Level);
      uVar2 = *(ulong *)pGVar1;
      if ((int)pGVar1[-(ulong)((uint)uVar2 & 0x1fffffff)].Value < 0) {
LAB_001eeb31:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar4 = (uint)(uVar2 >> 0x20);
      if ((int)pGVar1[-(ulong)(uVar4 & 0x1fffffff)].Value < 0) goto LAB_001eeb31;
      uVar4 = Gia_ManAppendAnd(pNew,(uint)(uVar2 >> 0x1d) & 1 ^
                                    pGVar1[-(ulong)((uint)uVar2 & 0x1fffffff)].Value,
                               pGVar1[-(ulong)(uVar4 & 0x1fffffff)].Value ^ uVar4 >> 0x1d & 1);
      goto LAB_001eeac0;
    }
  }
  pGVar5 = Gia_ManAppendObj(pNew);
  uVar2 = *(ulong *)pGVar5;
  *(ulong *)pGVar5 = uVar2 | 0x9fffffff;
  *(ulong *)pGVar5 =
       uVar2 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20;
  pGVar3 = pNew->pObjs;
  if ((pGVar3 <= pGVar5) && (pGVar5 < pGVar3 + pNew->nObjs)) {
    Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar5 - (long)pGVar3) >> 2) * -0x55555555);
    pGVar3 = pNew->pObjs;
    if ((pGVar3 <= pGVar5) && (pGVar5 < pGVar3 + pNew->nObjs)) {
      uVar4 = (int)((ulong)((long)pGVar5 - (long)pGVar3) >> 2) * 0x55555556;
LAB_001eeac0:
      pGVar1->Value = uVar4;
      return;
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManDupAndConesLimit_rec( Gia_Man_t * pNew, Gia_Man_t * p, int iObj, int Level )
{
    Gia_Obj_t * pObj = Gia_ManObj(p, iObj);
    if ( ~pObj->Value )
        return;
    if ( !Gia_ObjIsAnd(pObj) || Gia_ObjLevel(p, pObj) < Level )
    {
        pObj->Value = Gia_ManAppendCi( pNew );
        //printf( "PI %d for %d.\n", Abc_Lit2Var(pObj->Value), iObj );
        return;
    }
    Gia_ManDupAndConesLimit_rec( pNew, p, Gia_ObjFaninId0(pObj, iObj), Level );
    Gia_ManDupAndConesLimit_rec( pNew, p, Gia_ObjFaninId1(pObj, iObj), Level );
    pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    //printf( "Obj %d for %d.\n", Abc_Lit2Var(pObj->Value), iObj );
}